

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O0

Tensor * __thiscall
cnn::SimpleExecutionEngine::incremental_forward(SimpleExecutionEngine *this,VariableIndex *i)

{
  uint uVar1;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint *puVar7;
  size_type sVar8;
  const_reference ppNVar9;
  const_iterator this_01;
  const_iterator xs_00;
  reference t_;
  reference ppTVar10;
  float *pfVar11;
  undefined4 extraout_var;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *this_02;
  reference pvVar12;
  VariableIndex *in_RSI;
  VariableIndex *__ptr;
  long in_RDI;
  size_t aux_size;
  void *aux_mem;
  VariableIndex arg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range3;
  uint ai;
  Node *node;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *in_stack_fffffffffffffe88;
  Dim *in_stack_fffffffffffffe90;
  value_type in_stack_fffffffffffffe98;
  value_type pNVar13;
  AlignedMemoryPool<6U> *in_stack_fffffffffffffea0;
  uint *in_stack_fffffffffffffea8;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_stack_fffffffffffffeb0;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_78;
  Tensor *in_stack_ffffffffffffff90;
  uint local_4c;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> local_28;
  
  __ptr = in_RSI;
  puVar7 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  uVar1 = *puVar7;
  sVar8 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                    (*(vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> **)(in_RDI + 8));
  if (sVar8 <= uVar1) {
    __assert_fail("i < cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x27,
                  "virtual const Tensor &cnn::SimpleExecutionEngine::incremental_forward(VariableIndex)"
                 );
  }
  puVar7 = VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDI + 0x40));
  if (*puVar7 == 0) {
    AlignedMemoryPool<6U>::free(fxs,__ptr);
  }
  bVar5 = boost::operators_impl::operator>=
                    ((VariableIndex *)in_stack_fffffffffffffe90,
                     (VariableIndex *)in_stack_fffffffffffffe88);
  if (bVar5) {
    VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize
              (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
    std::allocator<const_cnn::Tensor_*>::allocator((allocator<const_cnn::Tensor_*> *)0x34a9b6);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::vector
              ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
               in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,
               (allocator_type *)in_stack_fffffffffffffea0);
    std::allocator<const_cnn::Tensor_*>::~allocator((allocator<const_cnn::Tensor_*> *)0x34a9df);
    while (bVar5 = boost::operators_impl::operator<=
                             ((VariableIndex *)in_stack_fffffffffffffe90,
                              (VariableIndex *)in_stack_fffffffffffffe88), bVar5) {
      this_00 = *(vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> **)(in_RDI + 8);
      puVar7 = VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDI + 0x40));
      ppNVar9 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                          (this_00,(ulong)*puVar7);
      pNVar13 = *ppNVar9;
      Node::arity((Node *)0x34aa69);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                 in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      local_4c = 0;
      this_01 = std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                          (in_stack_fffffffffffffe88);
      xs_00 = std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                        (in_stack_fffffffffffffe88);
      while (bVar5 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                                 *)in_stack_fffffffffffffe90,
                                (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                                 *)in_stack_fffffffffffffe88), bVar5) {
        t_ = __gnu_cxx::
             __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
             ::operator*((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)&stack0xffffffffffffffa0);
        VariableIndex::VariableIndex((VariableIndex *)&stack0xffffffffffffff94,t_);
        puVar7 = VariableIndex::operator_cast_to_unsigned_int_
                           ((VariableIndex *)&stack0xffffffffffffff94);
        pvVar12 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x10),
                             (ulong)*puVar7);
        ppTVar10 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::
                   operator[](&local_28,(ulong)local_4c);
        *ppTVar10 = pvVar12;
        local_4c = local_4c + 1;
        __gnu_cxx::
        __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
        ::operator++((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                      *)&stack0xffffffffffffffa0);
      }
      puVar7 = VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDI + 0x40));
      pvVar12 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                          ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x10),
                           (ulong)*puVar7);
      (pvVar12->d).bd = (pNVar13->dim).bd;
      uVar2 = *(undefined8 *)((pNVar13->dim).d + 2);
      uVar3 = *(undefined8 *)((pNVar13->dim).d + 4);
      uVar4 = *(undefined8 *)((pNVar13->dim).d + 6);
      *(undefined8 *)(pvVar12->d).d = *(undefined8 *)(pNVar13->dim).d;
      *(undefined8 *)((pvVar12->d).d + 2) = uVar2;
      *(undefined8 *)((pvVar12->d).d + 4) = uVar3;
      *(undefined8 *)((pvVar12->d).d + 6) = uVar4;
      Dim::size(in_stack_fffffffffffffe90);
      pfVar11 = (float *)AlignedMemoryPool<6U>::allocate
                                   (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
      puVar7 = VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDI + 0x40));
      pvVar12 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                          ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x10),
                           (ulong)*puVar7);
      pvVar12->v = pfVar11;
      puVar7 = VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDI + 0x40));
      pvVar12 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                          ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x10),
                           (ulong)*puVar7);
      if (pvVar12->v == (float *)0x0) {
        std::operator<<((ostream *)&std::cerr,"out of memory\n");
        abort();
      }
      local_78 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)0x0;
      iVar6 = (*pNVar13->_vptr_Node[4])();
      if ((CONCAT44(extraout_var,iVar6) != 0) &&
         (in_stack_fffffffffffffeb0 =
               (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
               AlignedMemoryPool<6U>::allocate
                         (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98),
         local_78 = in_stack_fffffffffffffeb0,
         in_stack_fffffffffffffeb0 == (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)0x0)) {
        std::operator<<((ostream *)&std::cerr,"aux out of memory\n");
        abort();
      }
      pNVar13->aux_mem = local_78;
      in_stack_fffffffffffffea0 = (AlignedMemoryPool<6U> *)(in_RDI + 0x10);
      in_stack_fffffffffffffea8 =
           VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDI + 0x40));
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)in_stack_fffffffffffffea0,
                 (ulong)*in_stack_fffffffffffffea8);
      Node::forward((Node *)this_01._M_current,
                    (vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                    xs_00._M_current,in_stack_ffffffffffffff90);
      in_stack_fffffffffffffe90 =
           (Dim *)VariableIndex::operator_cast_to_unsigned_int_((VariableIndex *)(in_RDI + 0x40));
      in_stack_fffffffffffffe90->d[0] = in_stack_fffffffffffffe90->d[0] + 1;
      in_stack_fffffffffffffe98 = pNVar13;
    }
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::~vector
              ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
               in_stack_fffffffffffffea0);
  }
  this_02 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x10);
  puVar7 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  pvVar12 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                      (this_02,(ulong)*puVar7);
  return pvVar12;
}

Assistant:

const Tensor& SimpleExecutionEngine::incremental_forward(VariableIndex i) {
  assert(i < cg.nodes.size());

  // free any old memory if this is a new CG
  if (num_nodes_evaluated == 0) fxs->free();

  if (i >= num_nodes_evaluated) {
    nfxs.resize(i + 1);

    //vector<string> dummy(5, "x");
    vector<const Tensor*> xs(16);
    for (; num_nodes_evaluated <= i; ++num_nodes_evaluated) {
      const Node* node = cg.nodes[num_nodes_evaluated];
      xs.resize(node->arity());
      unsigned ai = 0;
      for (VariableIndex arg : node->args) {
        xs[ai] = &nfxs[arg];
        ++ai;
      }
      nfxs[num_nodes_evaluated].d = node->dim;
      nfxs[num_nodes_evaluated].v = static_cast<float*>(fxs->allocate(node->dim.size() * sizeof(float)));
      if (nfxs[num_nodes_evaluated].v == nullptr) {
        cerr << "out of memory\n";
        abort();
      }
      void* aux_mem = nullptr;
      size_t aux_size = node->aux_storage_size();
      if (aux_size) {
        aux_mem = fxs->allocate(aux_size);
        if (!aux_mem) {
          cerr << "aux out of memory\n";
          abort();
        }
      }
      node->aux_mem = aux_mem;
      node->forward(xs, nfxs[num_nodes_evaluated]);
    }
  }
  return nfxs[i];
}